

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

IndexVector * __thiscall
Centaurus::CharClass<char>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<char> *this)

{
  pointer pRVar1;
  undefined8 in_RAX;
  int *piVar2;
  iterator iVar3;
  Range<char> *r;
  pointer pRVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  IndexVector::IndexVector
            (__return_storage_ptr__,
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,true);
  pRVar4 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar1) {
    do {
      iVar3._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      piVar2 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_38 = (ulong)CONCAT14(pRVar4->m_start,(int)local_38);
      if (iVar3._M_current == piVar2) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar3,
                   (int *)((long)&local_38 + 4));
        iVar3._M_current =
             (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        piVar2 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      }
      else {
        *iVar3._M_current = (uint)(byte)pRVar4->m_start;
        iVar3._M_current = iVar3._M_current + 1;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current;
      }
      local_38 = CONCAT44(local_38._4_4_,(uint)(byte)pRVar4->m_end);
      if (iVar3._M_current == piVar2) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar3,
                   (int *)&local_38);
      }
      else {
        *iVar3._M_current = (uint)(byte)pRVar4->m_end;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current + 1;
      }
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }